

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3MatchEName(ExprList_item *pItem,char *zCol,char *zTab,char *zDb,int *pbRowid)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  byte *pbVar6;
  ushort uVar7;
  
  uVar7 = *(ushort *)&(pItem->fg).field_0x1 & 3;
  if (uVar7 != 2) {
    if (pbRowid == (int *)0x0) {
      return 0;
    }
    if (uVar7 != 3) {
      return 0;
    }
  }
  lVar5 = 0;
  pcVar3 = pItem->zEName;
  while( true ) {
    if ((*pcVar3 == '\0') || (*pcVar3 == '.')) break;
    lVar5 = lVar5 + 1;
    pcVar3 = pcVar3 + 1;
  }
  if (zDb != (char *)0x0) {
    iVar4 = sqlite3_strnicmp(pItem->zEName,zDb,(int)lVar5);
    if (iVar4 != 0) {
      return 0;
    }
    if (zDb[lVar5] != '\0') {
      return 0;
    }
  }
  lVar5 = 0;
  for (pbVar6 = (byte *)(pcVar3 + 2); (pbVar6[-1] != 0 && (pbVar6[-1] != 0x2e)); pbVar6 = pbVar6 + 1
      ) {
    lVar5 = lVar5 + 1;
  }
  if (zTab != (char *)0x0) {
    iVar4 = sqlite3_strnicmp(pcVar3 + 1,zTab,(int)lVar5);
    if (iVar4 != 0) {
      return 0;
    }
    if (zTab[lVar5] != '\0') {
      return 0;
    }
  }
  if (zCol != (char *)0x0) {
    if (uVar7 != 3) {
      if (uVar7 != 2) {
        return 1;
      }
      do {
        bVar1 = *pbVar6;
        bVar2 = *zCol;
        if (bVar1 == bVar2) {
          if ((ulong)bVar1 == 0) goto LAB_00183d62;
        }
        else if (""[bVar1] != ""[bVar2]) {
LAB_00183d62:
          if (bVar1 != bVar2) {
            return 0;
          }
          return 1;
        }
        zCol = (char *)((byte *)zCol + 1);
        pbVar6 = pbVar6 + 1;
      } while( true );
    }
    iVar4 = sqlite3IsRowid(zCol);
    if (iVar4 == 0) {
      return 0;
    }
  }
  if (uVar7 == 3) {
    *pbRowid = 1;
    return 1;
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3MatchEName(
  const struct ExprList_item *pItem,
  const char *zCol,
  const char *zTab,
  const char *zDb,
  int *pbRowid
){
  int n;
  const char *zSpan;
  int eEName = pItem->fg.eEName;
  if( eEName!=ENAME_TAB && (eEName!=ENAME_ROWID || NEVER(pbRowid==0)) ){
    return 0;
  }
  assert( pbRowid==0 || *pbRowid==0 );
  zSpan = pItem->zEName;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zDb && (sqlite3StrNICmp(zSpan, zDb, n)!=0 || zDb[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zTab && (sqlite3StrNICmp(zSpan, zTab, n)!=0 || zTab[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  if( zCol ){
    if( eEName==ENAME_TAB && sqlite3StrICmp(zSpan, zCol)!=0 ) return 0;
    if( eEName==ENAME_ROWID && sqlite3IsRowid(zCol)==0 ) return 0;
  }
  if( eEName==ENAME_ROWID ) *pbRowid = 1;
  return 1;
}